

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

QString * wrapText(QString *names,int optionNameMaxWidth,QString *description)

{
  int iVar1;
  bool bVar2;
  qsizetype qVar3;
  QString *in_RCX;
  int in_EDX;
  QString *in_RSI;
  anon_class_24_3_3622c47a *in_RDI;
  long in_FS_OFFSET;
  qsizetype numChars;
  qsizetype nextLineStart;
  qsizetype breakAt;
  qsizetype i;
  qsizetype len;
  int x;
  int max;
  qsizetype lastBreakable;
  qsizetype lineStart;
  QString *text;
  QChar c;
  anon_class_24_3_3622c47a nextNameSection;
  int nameIndex;
  QLatin1StringView indentation;
  char16_t nl;
  QChar *in_stack_fffffffffffffe08;
  QStringView *in_stack_fffffffffffffe10;
  QStringBuilder<const_QLatin1StringView_&,_QString> *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  anon_class_24_3_3622c47a *n;
  QStringBuilder<QStringBuilder<const_QLatin1StringView_&,_QString>,_const_char16_t_&>
  *in_stack_fffffffffffffe38;
  QString *in_stack_fffffffffffffe40;
  QString *a;
  QString *pQVar4;
  QString *pQVar5;
  int local_1a0;
  QString *local_198;
  QString *local_190;
  byte in_stack_fffffffffffffe7e;
  QChar fill;
  QChar local_c2 [43];
  QChar local_6c;
  char16_t local_6a;
  int *local_60;
  int *local_58;
  int local_4c;
  QLatin1StringView local_48;
  undefined2 local_36;
  int local_34 [11];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_36 = 10;
  local_48.m_size = -0x5555555555555556;
  local_48.m_data = (char *)0xaaaaaaaaaaaaaaaa;
  n = in_RDI;
  local_34[0] = in_EDX;
  local_48 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffe18,(size_t)in_stack_fffffffffffffe10);
  local_4c = 0;
  local_60 = &local_4c;
  local_58 = local_34;
  fill.ucs = (char16_t)in_stack_fffffffffffffe7e;
  n->names = (QString *)0xaaaaaaaaaaaaaaaa;
  n->nameIndex = (int *)0xaaaaaaaaaaaaaaaa;
  n->optionNameMaxWidth = (int *)0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x179f81);
  local_190 = (QString *)0x0;
  local_198 = (QString *)0xffffffffffffffff;
  qVar3 = QLatin1StringView::size(&local_48);
  iVar1 = -((int)qVar3 + local_34[0] + 1);
  local_1a0 = 0;
  qVar3 = QString::size(in_RCX);
  for (pQVar5 = (QString *)0x0; (long)pQVar5 < qVar3; pQVar5 = (QString *)((long)&(pQVar5->d).d + 1)
      ) {
    local_1a0 = local_1a0 + 1;
    local_6a = 0xaaaa;
    local_6a = (char16_t)
               QString::at((QString *)in_stack_fffffffffffffe18,(qsizetype)in_stack_fffffffffffffe10
                          );
    bVar2 = QChar::isSpace((QChar *)0x17a02c);
    pQVar4 = pQVar5;
    if (!bVar2) {
      pQVar4 = local_198;
    }
    local_198 = pQVar4;
    pQVar4 = (QString *)0xffffffffffffffff;
    a = (QString *)0xffffffffffffffff;
    if ((iVar1 + 0x4f < local_1a0) && (local_198 != (QString *)0xffffffffffffffff)) {
      a = (QString *)((long)&(local_198->d).d + 1);
      pQVar4 = local_198;
    }
    else if (((iVar1 + 0x4e < local_1a0) && (local_198 == (QString *)0xffffffffffffffff)) ||
            (pQVar5 == (QString *)(qVar3 + -1))) {
      a = (QString *)((long)&(pQVar5->d).d + 1);
      pQVar4 = a;
    }
    else {
      QChar::QChar<char16_t,_true>(&local_6c,L'\n');
      bVar2 = operator==((QChar *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      if (bVar2) {
        a = (QString *)((long)&(pQVar5->d).d + 1);
        pQVar4 = pQVar5;
      }
    }
    in_stack_fffffffffffffe40 = a;
    if (pQVar4 != (QString *)0xffffffffffffffff) {
      in_stack_fffffffffffffe38 =
           (QStringBuilder<QStringBuilder<const_QLatin1StringView_&,_QString>,_const_char16_t_&> *)
           ((long)pQVar4 - (long)local_190);
      wrapText::anon_class_24_3_3622c47a::operator()(in_RDI);
      in_stack_fffffffffffffe18 =
           (QStringBuilder<const_QLatin1StringView_&,_QString> *)(long)local_34[0];
      QChar::QChar<char16_t,_true>(local_c2,L' ');
      QString::leftJustified(pQVar5,(qsizetype)pQVar4,fill,SUB81((ulong)a >> 0x38,0));
      operator+((QLatin1StringView *)in_stack_fffffffffffffe18,(QString *)in_stack_fffffffffffffe10)
      ;
      operator+(in_stack_fffffffffffffe18,(char16_t *)in_stack_fffffffffffffe10);
      operator+=(a,(QStringBuilder<QStringBuilder<const_QLatin1StringView_&,_QString>,_char16_t> *)
                   in_stack_fffffffffffffe38);
      QStringBuilder<QStringBuilder<const_QLatin1StringView_&,_QString>,_char16_t>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<const_QLatin1StringView_&,_QString>,_char16_t> *)
                 0x17a1e1);
      QStringBuilder<const_QLatin1StringView_&,_QString>::~QStringBuilder
                ((QStringBuilder<const_QLatin1StringView_&,_QString> *)0x17a1ee);
      QString::~QString((QString *)0x17a1fb);
      QString::~QString((QString *)0x17a208);
      QStringView::QStringView<QString,_true>
                ((QStringView *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                 (QString *)in_stack_fffffffffffffe18);
      QStringView::mid((QStringView *)in_RDI,(qsizetype)in_stack_fffffffffffffe38,(qsizetype)n);
      operator+(in_stack_fffffffffffffe10,&in_stack_fffffffffffffe08->ucs);
      operator+=(a,(QStringBuilder<QStringView,_const_char16_t_&> *)in_stack_fffffffffffffe38);
      local_1a0 = 0;
      local_198 = (QString *)0xffffffffffffffff;
      in_stack_fffffffffffffe27 = false;
      in_stack_fffffffffffffe40 = a;
      if ((long)a < qVar3) {
        QString::at((QString *)in_stack_fffffffffffffe18,(qsizetype)in_stack_fffffffffffffe10);
        in_stack_fffffffffffffe27 = QChar::isSpace((QChar *)0x17a2c1);
      }
      pQVar5 = a;
      local_190 = a;
      if ((bool)in_stack_fffffffffffffe27 != false) {
        pQVar5 = (QString *)((long)&(a->d).d + 1);
        local_190 = pQVar5;
      }
    }
  }
  while( true ) {
    pQVar5 = (QString *)(long)local_4c;
    qVar3 = QString::size(in_RSI);
    if (qVar3 <= (long)pQVar5) break;
    wrapText::anon_class_24_3_3622c47a::operator()(in_RDI);
    operator+((QLatin1StringView *)in_stack_fffffffffffffe18,pQVar5);
    operator+(in_stack_fffffffffffffe18,(char16_t *)pQVar5);
    operator+=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    QStringBuilder<QStringBuilder<const_QLatin1StringView_&,_QString>,_const_char16_t_&>::
    ~QStringBuilder((QStringBuilder<QStringBuilder<const_QLatin1StringView_&,_QString>,_const_char16_t_&>
                     *)0x17a397);
    QStringBuilder<const_QLatin1StringView_&,_QString>::~QStringBuilder
              ((QStringBuilder<const_QLatin1StringView_&,_QString> *)0x17a3a4);
    QString::~QString((QString *)0x17a3b1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString wrapText(const QString &names, int optionNameMaxWidth, const QString &description)
{
    const auto nl = u'\n';
    const auto indentation = "  "_L1;

    // In case the list of option names is very long, wrap it as well
    int nameIndex = 0;
    auto nextNameSection = [&]() {
        QString section = names.mid(nameIndex, optionNameMaxWidth);
        nameIndex += section.size();
        return section;
    };

    QString text;
    qsizetype lineStart = 0;
    qsizetype lastBreakable = -1;
    const int max = 79 - (indentation.size() + optionNameMaxWidth + 1);
    int x = 0;
    const qsizetype len = description.size();

    for (qsizetype i = 0; i < len; ++i) {
        ++x;
        const QChar c = description.at(i);
        if (c.isSpace())
            lastBreakable = i;

        qsizetype breakAt = -1;
        qsizetype nextLineStart = -1;
        if (x > max && lastBreakable != -1) {
            // time to break and we know where
            breakAt = lastBreakable;
            nextLineStart = lastBreakable + 1;
        } else if ((x > max - 1 && lastBreakable == -1) || i == len - 1) {
            // time to break but found nowhere [-> break here], or end of last line
            breakAt = i + 1;
            nextLineStart = breakAt;
        } else if (c == nl) {
            // forced break
            breakAt = i;
            nextLineStart = i + 1;
        }

        if (breakAt != -1) {
            const qsizetype numChars = breakAt - lineStart;
            //qDebug() << "breakAt=" << description.at(breakAt) << "breakAtSpace=" << breakAtSpace << lineStart << "to" << breakAt << description.mid(lineStart, numChars);
            text += indentation + nextNameSection().leftJustified(optionNameMaxWidth) + u' ';
            text += QStringView{description}.mid(lineStart, numChars) + nl;
            x = 0;
            lastBreakable = -1;
            lineStart = nextLineStart;
            if (lineStart < len && description.at(lineStart).isSpace())
                ++lineStart; // don't start a line with a space
            i = lineStart;
        }
    }

    while (nameIndex < names.size()) {
        text += indentation + nextNameSection() + nl;
    }

    return text;
}